

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_vdpp_proc.cpp
# Opt level: O0

void set_es_default_config(vdpp_api_params *p_api_params)

{
  vdpp_api_params *p_api_params_local;
  
  p_api_params->ptype = VDPP_PARAM_TYPE_ES;
  (p_api_params->param).com.sswap = VDPP_YUV_SWAP_SP_UV;
  (p_api_params->param).com.dfmt = 0x11;
  (p_api_params->param).com.dswap = 5;
  (p_api_params->param).com.src_width = 0x25;
  (p_api_params->param).com.src_height = 0x4b;
  (p_api_params->param).com.dst_width = 0x80;
  (p_api_params->param).com.dst_height = 0x80;
  (p_api_params->param).dmsr.wgt_pri_gain_odd_2 = 0x60;
  (p_api_params->param).dmsr.wgt_sec_gain = 0x20;
  (p_api_params->param).dmsr.blk_flat_th = 4;
  (p_api_params->param).dmsr.contrast_to_conf_map_x0 = 0x40;
  (p_api_params->param).dmsr.contrast_to_conf_map_x1 = 0x1000;
  (p_api_params->param).dmsr.contrast_to_conf_map_y0 = 0x1c00;
  (p_api_params->param).dmsr.contrast_to_conf_map_y1 = 0xff00;
  memcpy((void *)((long)&p_api_params->param + 0x38),set_es_default_config::diff2conf_lut_x_tmp,0x24
        );
  memcpy((void *)((long)&p_api_params->param + 0x5c),set_es_default_config::diff2conf_lut_y_tmp,0x24
        );
  (p_api_params->param).dmsr.edge_th_high_arr[6] = 1;
  return;
}

Assistant:

static void set_es_default_config(struct vdpp_api_params* p_api_params)
{
    static RK_S32 diff2conf_lut_x_tmp[9] = {
        0, 1024, 2048, 3072, 4096, 6144, 8192, 12288, 65535,
    };
    static RK_S32 diff2conf_lut_y_tmp[9] = {
        0, 84, 141, 179, 204, 233, 246, 253, 255,
    };

    p_api_params->ptype = VDPP_PARAM_TYPE_ES;
    p_api_params->param.es.es_bEnabledES          = 0;
    p_api_params->param.es.es_iAngleDelta         = 17;
    p_api_params->param.es.es_iAngleDeltaExtra    = 5;
    p_api_params->param.es.es_iGradNoDirTh        = 37;
    p_api_params->param.es.es_iGradFlatTh         = 75;
    p_api_params->param.es.es_iWgtGain            = 128;
    p_api_params->param.es.es_iWgtDecay           = 128;
    p_api_params->param.es.es_iLowConfTh          = 96;
    p_api_params->param.es.es_iLowConfRatio       = 32;
    p_api_params->param.es.es_iConfCntTh          = 4;
    p_api_params->param.es.es_iWgtLocalTh         = 64;
    p_api_params->param.es.es_iK1                 = 4096;
    p_api_params->param.es.es_iK2                 = 7168;
    p_api_params->param.es.es_iDeltaLimit         = 65280;
    memcpy(&p_api_params->param.es.es_iDiff2conf_lut_x[0], &diff2conf_lut_x_tmp[0],
           sizeof(diff2conf_lut_x_tmp));
    memcpy(&p_api_params->param.es.es_iDiff2conf_lut_y[0], &diff2conf_lut_y_tmp[0],
           sizeof(diff2conf_lut_y_tmp));
    p_api_params->param.es.es_bEndpointCheckEnable = 1;
}